

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_temp_impl(llama_token_data_array *cur_p,float temp)

{
  size_t i_1;
  size_t i;
  float max_l;
  size_t max_i;
  float temp_local;
  llama_token_data_array *cur_p_local;
  
  if (0.0 < temp) {
    for (i_1 = 0; i_1 < cur_p->size; i_1 = i_1 + 1) {
      cur_p->data[i_1].logit = cur_p->data[i_1].logit / temp;
    }
  }
  else {
    max_i = 0;
    max_l = cur_p->data->logit;
    for (i = 1; i < cur_p->size; i = i + 1) {
      if (cur_p->data[i].logit <= max_l) {
        cur_p->data[i].logit = -INFINITY;
      }
      else {
        cur_p->data[max_i].logit = -INFINITY;
        max_i = i;
        max_l = cur_p->data[i].logit;
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_temp_impl(llama_token_data_array * cur_p, float temp) {
    if (temp <= 0.0f) {
        // find the token with the highest logit and set the rest to -inf
        size_t max_i = 0;
        float  max_l = cur_p->data[0].logit;

        for (size_t i = 1; i < cur_p->size; ++i) {
            if (cur_p->data[i    ].logit > max_l) {
                cur_p->data[max_i].logit = -INFINITY;
                max_i = i;
                max_l = cur_p->data[i].logit;
            } else {
                cur_p->data[i].logit = -INFINITY;
            }
        }

        return;
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].logit /= temp;
    }
}